

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cpu.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_1e8ba::CpuTest_dex_clears_n_flag_Test::TestBody
          (CpuTest_dex_clears_n_flag_Test *this)

{
  bool bVar1;
  char *message;
  AssertHelper local_40 [3];
  Message local_28;
  undefined1 local_20 [8];
  AssertionResult gtest_ar;
  CpuTest_dex_clears_n_flag_Test *this_local;
  
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )this;
  n_e_s::core::test::CpuTest::stage_instruction(&this->super_CpuTest,0xca);
  (this->super_CpuTest).registers.x = 0x80;
  (this->super_CpuTest).registers.p = (this->super_CpuTest).registers.p | 0x80;
  (this->super_CpuTest).expected.x = '\x7f';
  (this->super_CpuTest).expected.p = '\0';
  n_e_s::core::test::CpuTest::step_execution(&this->super_CpuTest,'\x02');
  testing::internal::EqHelper::
  Compare<n_e_s::core::CpuRegisters,_n_e_s::core::CpuRegisters,_nullptr>
            ((EqHelper *)local_20,"expected","registers",&(this->super_CpuTest).expected,
             &(this->super_CpuTest).registers);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_20);
  if (!bVar1) {
    testing::Message::Message(&local_28);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_20);
    testing::internal::AssertHelper::AssertHelper
              (local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/nes_core-src/core/test/src/test_cpu.cpp"
               ,0x380,message);
    testing::internal::AssertHelper::operator=(local_40,&local_28);
    testing::internal::AssertHelper::~AssertHelper(local_40);
    testing::Message::~Message(&local_28);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_20);
  return;
}

Assistant:

TEST_F(CpuTest, dex_clears_n_flag) {
    stage_instruction(DEX);
    registers.x = 128;
    registers.p |= N_FLAG;
    expected.x = 127;
    expected.p = 0;

    step_execution(2);
    EXPECT_EQ(expected, registers);
}